

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

Float __thiscall pbrt::Vertex::PDF(Vertex *this,Integrator *integrator,Vertex *prev,Vertex *next)

{
  Vector3f wiRender;
  Vector3f woRender;
  long in_RDX;
  Point3<float> *in_RDI;
  float fVar1;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar9 [64];
  Point3f PVar11;
  Vector3<float> VVar12;
  Float unused;
  Float pdf;
  Vector3f wp;
  Vector3f wn;
  Vertex *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  Vector3<float> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  Vector3f *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  LogLevel in_stack_fffffffffffffe84;
  BxDFReflTransFlags in_stack_fffffffffffffe98;
  TransportMode in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  Float in_stack_fffffffffffffea4;
  Vertex *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  char *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffee0;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  Integrator *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  Tuple3<pbrt::Vector3,_float> local_ac;
  Tuple3<pbrt::Vector3,_float> local_a0;
  Tuple3<pbrt::Vector3,_float> local_8c;
  Tuple3<pbrt::Vector3,_float> local_80;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  Tuple3<pbrt::Vector3,_float> local_34;
  long local_20;
  Float local_4;
  
  auVar10 = in_ZMM0._8_56_;
  if ((in_RDI->super_Tuple3<pbrt::Point3,_float>).x == 1.4013e-45) {
    local_4 = PdfLight((Vertex *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff28,
                       (Vertex *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  }
  else {
    local_20 = in_RDX;
    PVar11 = p(in_stack_fffffffffffffe30);
    local_48 = PVar11.super_Tuple3<pbrt::Point3,_float>.z;
    auVar2._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar2._8_56_ = auVar10;
    local_50 = vmovlpd_avx(auVar2._0_16_);
    local_40 = local_50;
    local_38 = local_48;
    PVar11 = p(in_stack_fffffffffffffe30);
    local_68 = PVar11.super_Tuple3<pbrt::Point3,_float>.z;
    auVar3._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar3._8_56_ = auVar10;
    local_70 = vmovlpd_avx(auVar3._0_16_);
    local_60 = local_70;
    local_58 = local_68;
    VVar12 = Point3<float>::operator-((Point3<float> *)in_stack_fffffffffffffe30,in_RDI);
    local_80.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar10;
    local_80._0_8_ = vmovlpd_avx(auVar4._0_16_);
    local_34._0_8_ = local_80._0_8_;
    local_34.z = local_80.z;
    fVar1 = LengthSquared<float>((Vector3<float> *)&local_34);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      auVar10 = extraout_var;
      VVar12 = Normalize<float>(in_stack_fffffffffffffe40);
      local_a0.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar5._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar5._8_56_ = auVar10;
      local_a0._0_8_ = vmovlpd_avx(auVar5._0_16_);
      local_8c._0_8_ = local_a0._0_8_;
      local_8c.z = local_a0.z;
      local_34._0_8_ = local_a0._0_8_;
      local_34.z = local_a0.z;
      Vector3<float>::Vector3((Vector3<float> *)0x818e40);
      if (local_20 == 0) {
        if ((in_RDI->super_Tuple3<pbrt::Point3,_float>).x != 0.0) {
          LogFatal<char_const(&)[27]>
                    (in_stack_fffffffffffffe84,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                     (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     (char (*) [27])in_stack_fffffffffffffe60);
        }
      }
      else {
        PVar11 = p(in_stack_fffffffffffffe30);
        auVar6._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar6._8_56_ = auVar10;
        vmovlpd_avx(auVar6._0_16_);
        PVar11 = p(in_stack_fffffffffffffe30);
        auVar7._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar7._8_56_ = auVar10;
        vmovlpd_avx(auVar7._0_16_);
        VVar12 = Point3<float>::operator-((Point3<float> *)in_stack_fffffffffffffe30,in_RDI);
        local_ac.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar8._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar8._8_56_ = auVar10;
        local_ac._0_8_ = vmovlpd_avx(auVar8._0_16_);
        fVar1 = LengthSquared<float>((Vector3<float> *)&local_ac);
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          return 0.0;
        }
        auVar10 = extraout_var_00;
        VVar12 = Normalize<float>(in_stack_fffffffffffffe40);
        in_stack_fffffffffffffee0 = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar9._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar9._8_56_ = auVar10;
        in_stack_fffffffffffffed8 = vmovlpd_avx(auVar9._0_16_);
        local_ac._0_8_ = in_stack_fffffffffffffed8;
        local_ac.z = in_stack_fffffffffffffee0;
      }
      if ((in_RDI->super_Tuple3<pbrt::Point3,_float>).x == 0.0) {
        Interaction::SpawnRay
                  ((Interaction *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                   in_stack_fffffffffffffe60);
        CameraHandle::PDF_We
                  ((CameraHandle *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (Ray *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                   (Float *)in_stack_fffffffffffffe60,
                   (Float *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
      else if ((in_RDI->super_Tuple3<pbrt::Point3,_float>).x == 2.8026e-45) {
        woRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffee0;
        woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffed8;
        woRender.super_Tuple3<pbrt::Vector3,_float>.y = SUB84(in_stack_fffffffffffffed8,4);
        wiRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffec0;
        wiRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffffeb8;
        BSDF::PDF((BSDF *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),woRender,
                  wiRender,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
      }
      else {
        if ((in_RDI->super_Tuple3<pbrt::Point3,_float>).x != 4.2039e-45) {
          LogFatal(Verbose,in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                   in_stack_fffffffffffffeb8);
        }
        PhaseFunctionHandle::p
                  ((PhaseFunctionHandle *)in_stack_fffffffffffffe40,
                   (Vector3f *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                   (Vector3f *)in_stack_fffffffffffffe30);
      }
      local_4 = ConvertDensity(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                               (Vertex *)
                               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    else {
      local_4 = 0.0;
    }
  }
  return local_4;
}

Assistant:

Float PDF(const Integrator &integrator, const Vertex *prev,
              const Vertex &next) const {
        if (type == VertexType::Light)
            return PdfLight(integrator, next);
        // Compute directions to preceding and next vertex
        Vector3f wn = next.p() - p();
        if (LengthSquared(wn) == 0)
            return 0;
        wn = Normalize(wn);
        Vector3f wp;
        if (prev) {
            wp = prev->p() - p();
            if (LengthSquared(wp) == 0)
                return 0;
            wp = Normalize(wp);
        } else
            CHECK(type == VertexType::Camera);

        // Compute directional density depending on the vertex type
        Float pdf = 0, unused;
        if (type == VertexType::Camera)
            ei.camera.PDF_We(ei.SpawnRay(wn), &unused, &pdf);
        else if (type == VertexType::Surface)
            pdf = bsdf.PDF(wp, wn);
        else if (type == VertexType::Medium)
            pdf = mi.phase.p(wp, wn);
        else
            LOG_FATAL("Vertex::PDF(): Unimplemented");

        // Return probability per unit area at vertex _next_
        return ConvertDensity(pdf, next);
    }